

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O2

void __thiscall cppcms::impl::cgi::http::on_async_write_progress(http *this,bool completed)

{
  element_type *peVar1;
  undefined7 in_register_00000031;
  undefined1 local_40 [24];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  update_time(this);
  if ((int)CONCAT71(in_register_00000031,completed) != 0) {
    peVar1 = (this->watchdog_).
             super___shared_ptr<cppcms::impl::cgi::http_watchdog,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    self((http *)local_40);
    std::__weak_ptr<cppcms::impl::cgi::http,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<cppcms::impl::cgi::http,void>
              ((__weak_ptr<cppcms::impl::cgi::http,(__gnu_cxx::_Lock_policy)2> *)(local_40 + 0x10),
               (__shared_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2> *)local_40);
    std::
    _Rb_tree<std::weak_ptr<cppcms::impl::cgi::http>,_std::weak_ptr<cppcms::impl::cgi::http>,_std::_Identity<std::weak_ptr<cppcms::impl::cgi::http>_>,_std::owner_less<std::weak_ptr<cppcms::impl::cgi::http>_>,_std::allocator<std::weak_ptr<cppcms::impl::cgi::http>_>_>
    ::erase(&(peVar1->connections_)._M_t,(key_type *)(local_40 + 0x10));
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  }
  return;
}

Assistant:

void on_async_write_progress(bool completed)
		{
			update_time();
			if(completed)
				watchdog_->remove(self());
		}